

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O2

void __thiscall PP_edge::PP_edge(PP_edge *this,PP_edge *other)

{
  this->_vptr_PP_edge = (_func_int **)&PTR__PP_edge_00115c50;
  PP_point::PP_point(&this->p1,0.0,0.0,0.0,true);
  PP_point::PP_point(&this->p2,0.0,0.0,0.0,true);
  PP_point::operator=(&this->p1,&other->p1);
  PP_point::operator=(&this->p2,&other->p2);
  this->distp1p2 = other->distp1p2;
  return;
}

Assistant:

PP_edge( const PP_edge& other )
    {
        this->p1 = other.p1;
        this->p2 = other.p2;
        this->distp1p2 = other.distp1p2;
    }